

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::autoParent(tst_InsertProxyModel *this)

{
  bool bVar1;
  byte bVar2;
  QObject *this_00;
  InsertProxyModel *this_01;
  qint32 local_c4;
  qsizetype local_c0;
  undefined4 local_b4;
  undefined1 local_b0 [8];
  QSignalSpy testItemDestroyedSpy;
  InsertProxyModel *testItem;
  QObject *parentObj;
  tst_InsertProxyModel *this_local;
  
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  this_01 = (InsertProxyModel *)operator_new(0x18);
  InsertProxyModel::InsertProxyModel(this_01,this_00);
  testItemDestroyedSpy._120_8_ = this_01;
  QSignalSpy::QSignalSpy((QSignalSpy *)local_b0,(QObject *)this_01,"2destroyed(QObject *)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_b0);
  bVar2 = QTest::qVerify(bVar1,"testItemDestroyedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x59);
  if ((bVar2 & 1) == 0) {
    local_b4 = 1;
  }
  else {
    if (this_00 != (QObject *)0x0) {
      (**(code **)(*(long *)this_00 + 0x20))();
    }
    local_c0 = QList<QList<QVariant>_>::count
                         ((QList<QList<QVariant>_> *)&testItemDestroyedSpy.field_0x8);
    local_c4 = 1;
    bVar1 = QTest::qCompare<long_long,int>
                      (&local_c0,&local_c4,"testItemDestroyedSpy.count()","1",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                       ,0x5b);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_b4 = 0;
    }
    else {
      local_b4 = 1;
    }
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_b0);
  return;
}

Assistant:

void tst_InsertProxyModel::autoParent()
{
    QObject *parentObj = new QObject;
    auto testItem = new InsertProxyModel(parentObj);
    QSignalSpy testItemDestroyedSpy(testItem, SIGNAL(destroyed(QObject *)));
    QVERIFY(testItemDestroyedSpy.isValid());
    delete parentObj;
    QCOMPARE(testItemDestroyedSpy.count(), 1);
}